

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void enumerate(FILE *outf,char *groupname,dotNode *(*results) [7],float probeRad,int method,int nsel
              ,int spike,int outdots,int numSkinDots,float density)

{
  float fVar1;
  char *pcVar2;
  bool bVar3;
  double dVar4;
  float local_108;
  float local_104;
  char *local_100;
  undefined8 local_e8;
  char *mast [7];
  dotNode *local_a8;
  dotNode *node;
  double slen;
  double scaledGap;
  float a_radius;
  float scoreValue;
  float tscore;
  float tBscore;
  float tHscore;
  float tGscore;
  float score;
  float dtgp;
  float tsas;
  float psas;
  float tbslen;
  float thslen;
  float tbs;
  float ths;
  float tgs;
  float bslen;
  float hslen;
  float bs;
  float hs;
  float gs;
  int doit;
  int j;
  int i;
  float density_local;
  int spike_local;
  int nsel_local;
  int method_local;
  float probeRad_local;
  dotNode *(*results_local) [7];
  char *groupname_local;
  FILE *outf_local;
  
  memcpy(&local_e8,&PTR_anon_var_dwarf_eeb6_00154d90,0x38);
  fprintf((FILE *)outf,"        \nsubgroup: %s\n",groupname);
  fprintf((FILE *)outf,"atoms selected: %d\npotential dots: %d\npotential area: %.1f A^2\n",
          (double)((float)numSkinDots / density),(ulong)(uint)nsel,(ulong)(uint)numSkinDots);
  if ((nsel < 1) || (numSkinDots < 1)) {
    fprintf((FILE *)outf,"empty selection\n");
  }
  else {
    if (spike == 0) {
      fprintf((FILE *)outf,"  type                 #      %%\n");
    }
    else {
      fprintf((FILE *)outf,"  type                 #      %%       score score/A^2 x 1000\n");
    }
    score = 0.0;
    tbslen = 0.0;
    thslen = 0.0;
    tbs = 0.0;
    a_radius = 0.0;
    scoreValue = 0.0;
    tscore = 0.0;
    tBscore = 0.0;
    for (doit = 0; doit < 0x72; doit = doit + 1) {
      for (gs = 0.0; (int)gs < 7; gs = (float)((int)gs + 1)) {
        dtgp = 0.0;
        tHscore = 0.0;
        bslen = 0.0;
        hslen = 0.0;
        bs = 0.0;
        local_a8 = results[doit][(int)gs];
        bVar3 = local_a8 != (dotNode *)0x0;
        if (bVar3) {
          pcVar2 = getAtomName(doit);
          if (outdots == 0) {
            local_100 = mast[(long)(int)gs + -1];
          }
          else {
            local_100 = "external_dots ";
          }
          fprintf((FILE *)outf,"%3s %s ",pcVar2,local_100);
        }
        for (; local_a8 != (dotNode *)0x0; local_a8 = local_a8->next) {
          if (spike == 0) {
            bs = bs + 1.0;
          }
          else {
            if (((gs == 0.0) || (gs == 1.4013e-45)) || (gs == 2.8026e-45)) {
              bs = bs + 1.0;
              dVar4 = (double)(local_a8->gap / GAPweight);
              dVar4 = exp(-dVar4 * dVar4);
              scaledGap._4_4_ = (float)dVar4;
              tBscore = scaledGap._4_4_ + tBscore;
            }
            else if (((gs == 4.2039e-45) || (gs == 5.60519e-45)) || (gs == 7.00649e-45)) {
              bslen = bslen + 1.0;
              if (0.0 <= local_a8->gap) {
                local_104 = local_a8->gap;
              }
              else {
                local_104 = -local_a8->gap;
              }
              scaledGap._4_4_ = -BUMPweight * local_104 * 0.5;
              scoreValue = scaledGap._4_4_ + scoreValue;
            }
            else {
              hslen = hslen + 1.0;
              if (0.0 <= local_a8->gap) {
                local_108 = local_a8->gap;
              }
              else {
                local_108 = -local_a8->gap;
              }
              scaledGap._4_4_ = HBweight * local_108 * 0.5;
              tscore = scaledGap._4_4_ + tscore;
            }
            tHscore = scaledGap._4_4_ + tHscore;
          }
          if (method == 0) {
            fVar1 = local_a8->a->radius;
            dtgp = ((fVar1 + probeRad) * (fVar1 + probeRad)) / (fVar1 * fVar1) + dtgp;
          }
        }
        if (bVar3) {
          if (spike == 0) {
            fprintf((FILE *)outf,"%7.0f %5.1f%%\n",(double)bs,
                    ((double)bs * 100.0) / (double)numSkinDots);
          }
          else if (((gs == 0.0) || (gs == 1.4013e-45)) || (gs == 2.8026e-45)) {
            fprintf((FILE *)outf,"%7.0f %5.1f%% %9.1f %9.2f\n",(double)bs,
                    ((double)bs * 100.0) / (double)numSkinDots,(double)(tHscore / density),
                    ((double)tHscore * 1000.0) / (double)numSkinDots);
          }
          else if (((gs == 4.2039e-45) || (gs == 5.60519e-45)) || (gs == 7.00649e-45)) {
            fprintf((FILE *)outf,"%7.0f %5.1f%% %9.1f %9.2f\n",(double)bslen,
                    ((double)bslen * 100.0) / (double)numSkinDots,(double)(tHscore / density),
                    ((double)tHscore * 1000.0) / (double)numSkinDots);
          }
          else {
            fprintf((FILE *)outf,"%7.0f %5.1f%% %9.1f %9.2f\n",(double)hslen,
                    ((double)hslen * 100.0) / (double)numSkinDots,(double)(tHscore / density),
                    ((double)tHscore * 1000.0) / (double)numSkinDots);
          }
          tbs = bs + tbs;
          thslen = hslen + thslen;
          tbslen = bslen + tbslen;
          a_radius = tHscore + a_radius;
          if (method == 0) {
            score = dtgp + score;
          }
        }
      }
    }
    if (spike == 0) {
      fprintf((FILE *)outf,"             tot:  %7.0f %5.1f%%\n\n",(double)tbs,
              ((double)tbs * 100.0) / (double)numSkinDots);
      fprintf((FILE *)outf,"   contact surface area: %.1f A^2\n",(double)(tbs / density));
      if (method == 0) {
        fprintf((FILE *)outf,"accessible surface area: %.1f A^2\n\n",(double)(score / density));
      }
    }
    else {
      fprintf((FILE *)outf,"\n     tot contact:  %7.0f %5.1f%% %9.1f %9.2f\n",(double)tbs,
              ((double)tbs * 100.0) / (double)numSkinDots,(double)(tBscore / density),
              ((double)tBscore * 1000.0) / (double)numSkinDots);
      fprintf((FILE *)outf,"     tot overlap:  %7.0f %5.1f%% %9.1f %9.2f\n",(double)tbslen,
              ((double)tbslen * 100.0) / (double)numSkinDots,(double)(scoreValue / density),
              ((double)scoreValue * 1000.0) / (double)numSkinDots);
      fprintf((FILE *)outf,"     tot  H-bond:  %7.0f %5.1f%% %9.1f %9.2f\n",(double)thslen,
              ((double)thslen * 100.0) / (double)numSkinDots,(double)(tscore / density),
              ((double)tscore * 1000.0) / (double)numSkinDots);
      fprintf((FILE *)outf,"\n       grand tot:  %7.0f %5.1f%% %9.1f %9.2f\n",
              (double)(tbs + tbslen + thslen),
              ((double)(tbs + tbslen + thslen) * 100.0) / (double)numSkinDots,
              (double)(a_radius / density),((double)a_radius * 1000.0) / (double)numSkinDots);
      fprintf((FILE *)outf,"\ncontact surface area: %.1f A^2\n",
              (double)((tbs + tbslen + thslen) / density));
    }
  }
  return;
}

Assistant:

void enumerate(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH],
               float probeRad, int method,
	       int nsel, int spike, int outdots, int numSkinDots,
	       float density)
{
   int i, j, doit;
   float gs, hs, bs, hslen, bslen, tgs, ths, tbs, thslen, tbslen, psas, tsas;
   float dtgp, score, tGscore, tHscore, tBscore, tscore, scoreValue, a_radius;
   double scaledGap, slen;
   dotNode *node;
  /* char *mast[NODEWIDTH] = {"wide_contact  ", "close_contact ",
                            "small_overlap ", "bad_overlap   ", "H-bond        "};*/
    /* 04/10/2015 SJ changed to match the new categories, see NODEWIDTH in probe.h*/
    char *mast[NODEWIDTH] = {"wide_contact","close_contact","weak_H-bond","small_overlap","bad_overlap","worse_overlap","H-bond"};

   /* psas and tsas are the partial and total solvent accessible surface */

   fprintf(outf, "        \nsubgroup: %s\n", groupname);
   fprintf(outf, "atoms selected: %d\npotential dots: %d\npotential area: %.1f A^2\n",
				 nsel, numSkinDots, numSkinDots/density);

   if (nsel <= 0 || numSkinDots <= 0) {
      fprintf(outf, "empty selection\n");
      return;
   }
   if (spike) {
      fprintf(outf, "  type                 #      %%       score score/A^2 x 1000\n");
   }
   else {
      fprintf(outf, "  type                 #      %%\n");
   }

   tgs = ths = thslen = tbs = tbslen = tsas = 0.0;
   tGscore = tHscore = tBscore = tscore = 0.0;
   for (i = 0; i < NUMATOMTYPES; i++)
   {
       for (j = 0; j < NODEWIDTH; j++)
       {
           gs = hs = hslen = bs = bslen = score = psas = 0.0;
           node = results[i][j];
           doit = (node != NULL);
           if (doit) {
               fprintf(outf, "%3s %s ", getAtomName(i),
	                   outdots?"external_dots ":mast[j]);
           }
           while(node)
           {
               if (spike)/* 04/10/2015 SJ changed the if statements in this block to reflect change in dots ordering, see NODEWIDTH in probe.h*/
               {
                  // if (j == 0 || j == 1) { /* contact dot */
                   if(j==0 || j ==1 || j ==2) { /* contact dot, and weak H bond*/
                       gs += 1.0;
                       dtgp = node->gap;
                       scaledGap = dtgp/GAPweight;
                       scoreValue = exp(-scaledGap*scaledGap);
                       score   += scoreValue;
                       tGscore += scoreValue;
                   }
                  // else if (j == 2 || j == 3) { /* bump */
                   else if (j ==3 || j ==4 || j ==5){ /* bump*/
                       bs += 1.0;
                       slen = 0.5*FABS(node->gap);
                       bslen += slen;
                       scoreValue = - BUMPweight * slen;
                       score   += scoreValue;
                       tBscore += scoreValue;
                   }
                   else { /* H-bond */
                       hs += 1.0;
                       slen = 0.5*FABS(node->gap);
                       hslen += slen;
                       scoreValue = HBweight * slen;
                       score   += scoreValue;
                       tHscore += scoreValue;
                   }
               }
               else { gs += 1.0; }

               if (method == EXTERNALSURFACE) {
                   a_radius = node->a->radius;
                   psas += (a_radius + probeRad)*(a_radius + probeRad)/(a_radius * a_radius);
               }
               node = node->next;
           }
           if (doit)/* 04/10/2015 SJ changed the if statements in this block to reflect change in dots ordering, see NODEWIDTH in probe.h*/
           {
               if (spike) {
                  // if (j == 0 || j == 1) { /* contact dot */
                   if(j==0 || j ==1 || j ==2) { /* contact dot, and weak H bond*/
                        fprintf(outf, "%7.0f %5.1f%% %9.1f %9.2f\n",
                                gs, 100.0*gs/numSkinDots, score/density,
                                1000.0*score/numSkinDots);
                   }
                  // else if (j == 2 || j == 3) { /* bump */
                   else if (j ==3 || j ==4 || j ==5){ /* bump*/
                        fprintf(outf, "%7.0f %5.1f%% %9.1f %9.2f\n",
                                bs, 100.0*bs/numSkinDots, score/density,
                                1000.0*score/numSkinDots);
                   }
                   else { /* H-bond */
                        fprintf(outf, "%7.0f %5.1f%% %9.1f %9.2f\n",
                                hs, 100.0*hs/numSkinDots, score/density,
                                1000.0*score/numSkinDots);
                   }
               }
               else {
                   fprintf(outf, "%7.0f %5.1f%%\n",
                           gs, 100.0*gs/numSkinDots);
               }
               tgs += gs;
               ths += hs;
               thslen += hslen;
               tbs += bs;
               tbslen += bslen;
               tscore += score;
               if (method == EXTERNALSURFACE) {
                   tsas += psas; /* tally the solvent accessible surface */
               }
           }
       }
   }
   if (spike) {
/*      fprintf(outf, "                                   score/A^2 x 1000\n");*/
      fprintf(outf, "\n     tot contact:  %7.0f %5.1f%% %9.1f %9.2f\n",
		    tgs, 100.0*tgs/numSkinDots, tGscore/density,
		     1000.0*tGscore/numSkinDots);
      fprintf(outf,   "     tot overlap:  %7.0f %5.1f%% %9.1f %9.2f\n",
		    tbs,    100.0*tbs/numSkinDots, tBscore/density,
		     1000.0*tBscore/numSkinDots);
      fprintf(outf,   "     tot  H-bond:  %7.0f %5.1f%% %9.1f %9.2f\n",
		    ths,    100.0*ths/numSkinDots, tHscore/density,
		     1000.0*tHscore/numSkinDots);

      fprintf(outf, "\n       grand tot:  %7.0f %5.1f%% %9.1f %9.2f\n",
		    (tgs+tbs+ths),
		    100.0*(tgs+tbs+ths)/numSkinDots,
		    tscore/density, 1000.0*tscore/numSkinDots);
      fprintf(outf, "\ncontact surface area: %.1f A^2\n",
		     (tgs+tbs+ths)/density);
   }
   else {
      fprintf(outf, "             tot:  %7.0f %5.1f%%\n\n",
		     tgs, 100.0*tgs/numSkinDots);
      fprintf(outf, "   contact surface area: %.1f A^2\n",
		     tgs/density);
      if (method == EXTERNALSURFACE) {
	 fprintf(outf, "accessible surface area: %.1f A^2\n\n",
		     tsas/density);
      }
   }
}